

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_argv.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_302a40::ArgParser::argZopfli(ArgParser *this)

{
  bool bVar1;
  char *s;
  shared_ptr<QPDFLogger> logger;
  
  QPDFLogger::defaultLogger();
  bVar1 = Pl_Flate::zopfli_supported();
  if (bVar1) {
    bVar1 = Pl_Flate::zopfli_enabled();
    if (bVar1) {
      s = "zopfli support is enabled, and zopfli is active\n";
    }
    else {
      QPDFLogger::info(logger.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       "zopfli support is enabled but not active\n");
      QPDFLogger::info(logger.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       "Set the environment variable QPDF_ZOPFLI to activate.\n");
      QPDFLogger::info(logger.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       "* QPDF_ZOPFLI=disabled or QPDF_ZOPFLI not set: don\'t use zopfli.\n");
      QPDFLogger::info(logger.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       "* QPDF_ZOPFLI=force: use zopfli, and fail if not available.\n");
      QPDFLogger::info(logger.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       "* QPDF_ZOPFLI=silent: use zopfli if available and silently fall back if not.\n"
                      );
      s = "* QPDF_ZOPFLI= any other value: use zopfli if available, and warn if not.\n";
    }
    QPDFLogger::info(logger.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,s);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&logger.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    return;
  }
  QPDFLogger::error(logger.super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                    "zopfli support is not enabled\n");
  exit(2);
}

Assistant:

void
ArgParser::argZopfli()
{
    auto logger = QPDFLogger::defaultLogger();
    if (Pl_Flate::zopfli_supported()) {
        if (Pl_Flate::zopfli_enabled()) {
            logger->info("zopfli support is enabled, and zopfli is active\n");
        } else {
            logger->info("zopfli support is enabled but not active\n");
            logger->info("Set the environment variable QPDF_ZOPFLI to activate.\n");
            logger->info("* QPDF_ZOPFLI=disabled or QPDF_ZOPFLI not set: don't use zopfli.\n");
            logger->info("* QPDF_ZOPFLI=force: use zopfli, and fail if not available.\n");
            logger->info(
                "* QPDF_ZOPFLI=silent: use zopfli if available and silently fall back if not.\n");
            logger->info(
                "* QPDF_ZOPFLI= any other value: use zopfli if available, and warn if not.\n");
        }
    } else {
        logger->error("zopfli support is not enabled\n");
        std::exit(qpdf_exit_error);
    }
}